

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> *
ftxui::CellToGlyphIndex(vector<int,_std::allocator<int>_> *__return_storage_ptr__,string *input)

{
  uint32_t ucs;
  bool bVar1;
  int *piVar2;
  size_t start;
  iterator __position;
  int x;
  uint32_t codepoint;
  size_t end;
  int local_40;
  uint32_t local_3c;
  size_t local_38;
  
  local_40 = -1;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve(__return_storage_ptr__,input->_M_string_length);
  local_38 = 0;
  if (input->_M_string_length != 0) {
    start = 0;
    do {
      local_3c = 0;
      bVar1 = EatCodePoint(input,start,&local_38,&local_3c);
      start = local_38;
      ucs = local_3c;
      if ((bVar1) && (local_3c != 0)) {
        if (local_3c < 0x20) {
          if (local_3c == 10) {
LAB_0010c9db:
            bVar1 = IsCombining(local_3c);
            if (bVar1) {
              if (local_40 == -1) {
                local_40 = 0;
                __position._M_current =
                     (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                     .super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) goto LAB_0010ca6e;
                *__position._M_current = 0;
                goto LAB_0010ca64;
              }
            }
            else {
              bVar1 = IsFullWidth(ucs);
              local_40 = local_40 + 1;
              __position._M_current =
                   (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              piVar2 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>).
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
              if (bVar1) {
                if (__position._M_current == piVar2) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__position,
                             &local_40);
                  __position._M_current =
                       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
                  piVar2 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>).
                           _M_impl.super__Vector_impl_data._M_end_of_storage;
                }
                else {
                  *__position._M_current = local_40;
                  __position._M_current = __position._M_current + 1;
                  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = __position._M_current;
                }
                if (__position._M_current == piVar2) {
LAB_0010ca6e:
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__position,
                             &local_40);
                  goto LAB_0010ca7b;
                }
                *__position._M_current = local_40;
              }
              else {
                if (__position._M_current == piVar2) goto LAB_0010ca6e;
                *__position._M_current = local_40;
              }
LAB_0010ca64:
              (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
          }
        }
        else if (0x20 < local_3c - 0x7f) goto LAB_0010c9db;
      }
LAB_0010ca7b:
    } while (start < input->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> CellToGlyphIndex(const std::string& input) {
  int x = -1;
  std::vector<int> out;
  out.reserve(input.size());
  size_t start = 0;
  size_t end = 0;
  while (start < input.size()) {
    uint32_t codepoint = 0;
    const bool eaten = EatCodePoint(input, start, &end, &codepoint);
    start = end;

    // Ignore invalid / control characters.
    if (!eaten || IsControl(codepoint)) {
      continue;
    }

    // Combining characters are put with the previous glyph they are modifying.
    if (IsCombining(codepoint)) {
      if (x == -1) {
        ++x;
        out.push_back(x);
      }
      continue;
    }

    // Fullwidth characters take two cells. The second is made of the empty
    // string to reserve the space the first is taking.
    if (IsFullWidth(codepoint)) {
      ++x;
      out.push_back(x);
      out.push_back(x);
      continue;
    }

    // Normal characters:
    ++x;
    out.push_back(x);
  }
  return out;
}